

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O0

int right_of_aliens_proc(Am_Object *param_1)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object local_48;
  int local_40;
  int right;
  Am_Object local_30;
  Am_Object this_alien;
  Am_Value_List aliens;
  Am_Object *param_0_local;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0xb2e8,0x82);
  Am_Value_List::Am_Value_List((Am_Value_List *)&this_alien,pAVar5);
  Am_Object::Am_Object(&local_30);
  Am_Object::Get_Owner(&local_48,0x10b2e8);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_48,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::~Am_Object(&local_48);
  local_40 = iVar2;
  Am_Value_List::End();
  do {
    bVar1 = Am_Value_List::First();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      param_0_local._4_4_ = local_40;
LAB_001057e7:
      Am_Object::~Am_Object(&local_30);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&this_alien);
      return param_0_local._4_4_;
    }
    pAVar5 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_30,pAVar5);
    Am_Object::Get((ushort)&local_30,0xb0);
    bVar1 = Am_Value::Valid();
    iVar2 = local_40;
    if ((bVar1 & 1) != 0) {
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,100);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_30,0x66);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      param_0_local._4_4_ = ((iVar2 - iVar3) - iVar4) + -10;
      goto LAB_001057e7;
    }
    Am_Value_List::Prev();
  } while( true );
}

Assistant:

Am_Define_No_Self_Formula(int, right_of_aliens)
{
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object this_alien;
  int right = Aliens.Get_Owner().Get(Am_WIDTH);
  for (aliens.End(); !aliens.First(); aliens.Prev()) {
    this_alien = aliens.Get();
    if (this_alien.Get(Am_IMAGE).Valid()) {
      return right - (int)this_alien.Get(Am_LEFT) -
             (int)this_alien.Get(Am_WIDTH) - 10;
    }
  }
  return right;
}